

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O2

void __thiscall
Imf_3_2::Array2D<unsigned_int>::resizeErase(Array2D<unsigned_int> *this,long sizeX,long sizeY)

{
  uint *puVar1;
  
  puVar1 = (uint *)operator_new__(-(ulong)((ulong)(sizeY * sizeX) >> 0x3e != 0) | sizeY * sizeX * 4)
  ;
  if (this->_data != (uint *)0x0) {
    operator_delete__(this->_data);
  }
  this->_sizeX = sizeX;
  this->_sizeY = sizeY;
  this->_data = puVar1;
  return;
}

Assistant:

inline void
Array2D<T>::resizeErase (long sizeX, long sizeY)
{
    T* tmp = new T[sizeX * sizeY];
    delete[] _data;
    _sizeX = sizeX;
    _sizeY = sizeY;
    _data  = tmp;
}